

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# junction.cpp
# Opt level: O1

void __thiscall Junction::Junction(Junction *this,string *name_)

{
  pointer pcVar1;
  string local_40;
  
  pcVar1 = (name_->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + name_->_M_string_length);
  Node::Node(&this->super_Node,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  (this->super_Node).super_Element._vptr_Element = (_func_int **)&PTR__Junction_00156c10;
  Demand::Demand(&this->primaryDemand);
  (this->demands).super__List_base<Demand,_std::allocator<Demand>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->demands;
  (this->demands).super__List_base<Demand,_std::allocator<Demand>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->demands;
  (this->demands).super__List_base<Demand,_std::allocator<Demand>_>._M_impl._M_node._M_size = 0;
  this->pMin = -999999999.9;
  this->pFull = -999999999.9;
  this->emitter = (Emitter *)0x0;
  return;
}

Assistant:

Junction::Junction(string name_):
    Node(name_),
    pMin(MISSING),
    pFull(MISSING),
    emitter(nullptr)
{
}